

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O0

StackInst * __thiscall
wasm::StackIRGenerator::makeStackInst(StackIRGenerator *this,Op op,Expression *origin)

{
  bool bVar1;
  Type local_48;
  Type local_40;
  BasicType local_34;
  Type local_30;
  Type stackType;
  StackInst *ret;
  Expression *origin_local;
  Op op_local;
  StackIRGenerator *this_local;
  
  stackType.id = (uintptr_t)MixedArena::alloc<wasm::StackInst>(&this->module->allocator);
  ((StackInst *)stackType.id)->op = op;
  ((StackInst *)stackType.id)->origin = origin;
  local_30.id = (origin->type).id;
  bVar1 = Expression::is<wasm::Block>(origin);
  if ((((bVar1) || (bVar1 = Expression::is<wasm::Loop>(origin), bVar1)) ||
      (bVar1 = Expression::is<wasm::If>(origin), bVar1)) ||
     (bVar1 = Expression::is<wasm::Try>(origin), bVar1)) {
    local_34 = unreachable;
    bVar1 = wasm::Type::operator==(&local_30,&local_34);
    if (bVar1) {
      wasm::Type::Type(&local_40,none);
      local_30.id = local_40.id;
    }
    else if (((op != BlockEnd) && (op != IfEnd)) && ((op != LoopEnd && (op != TryEnd)))) {
      wasm::Type::Type(&local_48,none);
      local_30.id = local_48.id;
    }
  }
  *(uintptr_t *)(stackType.id + 0x10) = local_30.id;
  return (StackInst *)stackType.id;
}

Assistant:

StackInst* StackIRGenerator::makeStackInst(StackInst::Op op,
                                           Expression* origin) {
  auto* ret = module.allocator.alloc<StackInst>();
  ret->op = op;
  ret->origin = origin;
  auto stackType = origin->type;
  if (origin->is<Block>() || origin->is<Loop>() || origin->is<If>() ||
      origin->is<Try>()) {
    if (stackType == Type::unreachable) {
      // There are no unreachable blocks, loops, or ifs. we emit extra
      // unreachables to fix that up, so that they are valid as having none
      // type.
      stackType = Type::none;
    } else if (op != StackInst::BlockEnd && op != StackInst::IfEnd &&
               op != StackInst::LoopEnd && op != StackInst::TryEnd) {
      // If a concrete type is returned, we mark the end of the construct has
      // having that type (as it is pushed to the value stack at that point),
      // other parts are marked as none).
      stackType = Type::none;
    }
  }
  ret->type = stackType;
  return ret;
}